

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O3

void duckdb::
     HistogramFinalizeFunction<duckdb::HistogramFunctor,double,duckdb::DefaultMapType<std::map<double,unsigned_long,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  ulong uVar1;
  ulong *puVar2;
  long lVar3;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar5;
  undefined8 uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ulong uVar8;
  _Rb_tree_node_base *p_Var9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  idx_t iVar12;
  idx_t iVar13;
  long lVar14;
  ulong uVar15;
  idx_t i;
  ulong uVar16;
  UnifiedVectorFormat sdata;
  undefined8 local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  Vector *local_a8;
  long local_a0;
  long local_98;
  ulong local_90;
  idx_t local_88;
  unsigned_long local_80;
  long *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_88 = offset;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  FlatVector::VerifyFlatVector(result);
  uVar8 = duckdb::ListVector::GetListSize(result);
  if (count == 0) {
    lVar14 = 0;
  }
  else {
    lVar14 = 0;
    iVar12 = 0;
    do {
      iVar13 = iVar12;
      if (*local_78 != 0) {
        iVar13 = (idx_t)*(uint *)(*local_78 + iVar12 * 4);
      }
      lVar3 = **(long **)(local_70 + iVar13 * 8);
      if (lVar3 != 0) {
        lVar14 = lVar14 + *(long *)(lVar3 + 0x28);
      }
      iVar12 = iVar12 + 1;
    } while (count != iVar12);
  }
  duckdb::ListVector::Reserve(result,lVar14 + uVar8);
  local_a0 = duckdb::MapVector::GetKeys(result);
  lVar14 = duckdb::MapVector::GetValues(result);
  if (count != 0) {
    local_98 = *(long *)(result + 0x20);
    lVar14 = *(long *)(lVar14 + 0x20);
    local_a8 = result + 0x30;
    uVar16 = 0;
    local_90 = count;
    do {
      uVar15 = uVar16;
      if (*local_78 != 0) {
        uVar15 = (ulong)*(uint *)(*local_78 + uVar16 * 4);
      }
      uVar1 = uVar16 + local_88;
      lVar3 = **(long **)(local_70 + uVar15 * 8);
      if (lVar3 == 0) {
        _Var11._M_head_impl = *(unsigned_long **)(result + 0x28);
        if (_Var11._M_head_impl == (unsigned_long *)0x0) {
          local_80 = *(unsigned_long *)(result + 0x40);
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_b8,&local_80);
          p_Var7 = p_Stack_b0;
          uVar6 = local_b8;
          local_b8 = 0;
          p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = uVar6;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var7;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
          }
          pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               local_a8);
          _Var11._M_head_impl =
               (pTVar10->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(unsigned_long **)(result + 0x28) = _Var11._M_head_impl;
        }
        bVar5 = (byte)uVar1 & 0x3f;
        _Var11._M_head_impl[uVar1 >> 6] =
             _Var11._M_head_impl[uVar1 >> 6] & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      }
      else {
        puVar2 = (ulong *)(local_98 + uVar1 * 0x10);
        *(ulong *)(local_98 + uVar1 * 0x10) = uVar8;
        p_Var9 = *(_Rb_tree_node_base **)(lVar3 + 0x18);
        uVar15 = uVar8;
        if (p_Var9 != (_Rb_tree_node_base *)(lVar3 + 8)) {
          lVar4 = *(long *)(local_a0 + 0x20);
          do {
            *(undefined8 *)(lVar4 + uVar15 * 8) = *(undefined8 *)(p_Var9 + 1);
            *(_Base_ptr *)(lVar14 + uVar15 * 8) = p_Var9[1]._M_parent;
            uVar15 = uVar15 + 1;
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
          } while (p_Var9 != (_Rb_tree_node_base *)(lVar3 + 8));
          uVar8 = *puVar2;
        }
        puVar2[1] = uVar15 - uVar8;
        count = local_90;
        uVar8 = uVar15;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != count);
  }
  duckdb::ListVector::SetListSize(result,uVar8);
  duckdb::Vector::Verify((ulong)result);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

static void HistogramFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                      idx_t offset) {
	using HIST_STATE = HistogramAggState<T, typename MAP_TYPE::MAP_TYPE>;

	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HIST_STATE *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			continue;
		}
		new_entries += state.hist->size();
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (auto &entry : *state.hist) {
			OP::template HistogramFinalize<T>(entry.first, keys, current_offset);
			count_entries[current_offset] = entry.second;
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}